

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O0

int main(int32 argc,char **argv)

{
  mgau_model_t *g;
  ms_mgau_model_t *msg;
  adapt_am_t *ad;
  long lVar1;
  char *pcVar2;
  char *ctlmllrfile;
  long lVar3;
  ptmr_t local_4058;
  cmd_ln_t *local_4020;
  cmd_ln_t *config;
  char sent [16384];
  char **argv_local;
  int32 argc_local;
  
  sent._16376_8_ = argv;
  cmd_ln_appl_enter(argc,argv,"default.arg",defn);
  local_4020 = cmd_ln_get();
  lVar1 = cmd_ln_int_r(local_4020,"-ctloffset");
  ctloffset = (int32)lVar1;
  sentfile = cmd_ln_str_r(local_4020,"-insent");
  sentfp = (FILE *)fopen(sentfile,"r");
  if ((FILE *)sentfp == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                   ,0x3aa,"Failed to open file %s for reading",sentfile);
    exit(1);
  }
  pcVar2 = cmd_ln_str_r(local_4020,"-s2stsegdir");
  if (pcVar2 != (char *)0x0) {
    pcVar2 = cmd_ln_str_r(local_4020,"-s2stsegdir");
    s2stsegdir = __ckd_salloc__(pcVar2,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                                ,0x3ae);
  }
  pcVar2 = cmd_ln_str_r(local_4020,"-stsegdir");
  if (pcVar2 != (char *)0x0) {
    pcVar2 = cmd_ln_str_r(local_4020,"-stsegdir");
    stsegdir = __ckd_salloc__(pcVar2,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                              ,0x3b0);
  }
  pcVar2 = cmd_ln_str_r(local_4020,"-phsegdir");
  if (pcVar2 != (char *)0x0) {
    pcVar2 = cmd_ln_str_r(local_4020,"-phsegdir");
    phsegdir = __ckd_salloc__(pcVar2,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                              ,0x3b2);
  }
  pcVar2 = cmd_ln_str_r(local_4020,"-phlabdir");
  if (pcVar2 != (char *)0x0) {
    pcVar2 = cmd_ln_str_r(local_4020,"-phlabdir");
    phlabdir = __ckd_salloc__(pcVar2,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                              ,0x3b4);
  }
  pcVar2 = cmd_ln_str_r(local_4020,"-wdsegdir");
  if (pcVar2 != (char *)0x0) {
    pcVar2 = cmd_ln_str_r(local_4020,"-wdsegdir");
    wdsegdir = __ckd_salloc__(pcVar2,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                              ,0x3b6);
  }
  do {
    if (ctloffset < 1) {
LAB_00118629:
      outsentfile = cmd_ln_str_r(local_4020,"-outsent");
      if ((outsentfile != (char *)0x0) &&
         (outsentfp = (FILE *)fopen(outsentfile,"w"), (FILE *)outsentfp == (FILE *)0x0)) {
        err_msg_system(ERR_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                       ,0x3cc,"Failed to open file %s for writing",outsentfile);
        exit(1);
      }
      outctlfile = cmd_ln_str_r(local_4020,"-outctl");
      if ((outctlfile != (char *)0x0) &&
         (outctlfp = (FILE *)fopen(outctlfile,"w"), (FILE *)outctlfp == (FILE *)0x0)) {
        err_msg_system(ERR_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                       ,0x3d1,"Failed top open file %s for writing",outctlfile);
        exit(1);
      }
      pcVar2 = cmd_ln_str_r(local_4020,"-s2stsegdir");
      if ((((pcVar2 == (char *)0x0) &&
           (pcVar2 = cmd_ln_str_r(local_4020,"-stsegdir"), pcVar2 == (char *)0x0)) &&
          (pcVar2 = cmd_ln_str_r(local_4020,"-phlabdir"), pcVar2 == (char *)0x0)) &&
         (((pcVar2 = cmd_ln_str_r(local_4020,"-phsegdir"), pcVar2 == (char *)0x0 &&
           (pcVar2 = cmd_ln_str_r(local_4020,"-wdsegdir"), pcVar2 == (char *)0x0)) &&
          (pcVar2 = cmd_ln_str_r(local_4020,"-outsent"), pcVar2 == (char *)0x0)))) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                ,0x3da,"Missing output file/directory argument(s)\n");
        exit(1);
      }
      models_init(local_4020);
      if (feat == (float32 ***)0x0) {
        feat = feat_array_alloc(kbc->fcb,15000);
      }
      timers[0].name = "U";
      timers[1].name = "G";
      timers[2].name = "S";
      timers[3].name = "A";
      align_init(kbc->mdef,kbc->tmat,dict,local_4020,kbc->logmath);
      printf("\n");
      pcVar2 = cmd_ln_str_r(local_4020,"-mllr");
      ad = adapt_am;
      if (pcVar2 != (char *)0x0) {
        if (kbc->mgau == (mgau_model_t *)0x0) {
          if (kbc->ms_mgau == (ms_mgau_model_t *)0x0) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                    ,0x3f3,"Can\'t use MLLR matrices with .s2semi. yet\n");
          }
          else {
            msg = kbc->ms_mgau;
            pcVar2 = cmd_ln_str_r(local_4020,"-mllr");
            model_set_mllr(msg,pcVar2,(char *)0x0,kbc->fcb,kbc->mdef,local_4020);
          }
        }
        else {
          g = kbc->mgau;
          pcVar2 = cmd_ln_str_r(local_4020,"-mllr");
          adapt_set_mllr(ad,g,pcVar2,(char *)0x0,kbc->mdef,local_4020);
        }
      }
      tot_nfr = 0;
      pcVar2 = cmd_ln_str_r(local_4020,"-ctl");
      if (pcVar2 == (char *)0x0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                ,0x405," -ctl are not specified.\n");
        exit(1);
      }
      pcVar2 = cmd_ln_str_r(local_4020,"-ctl");
      ctlmllrfile = cmd_ln_str_r(local_4020,"-ctl_mllr");
      lVar1 = cmd_ln_int_r(local_4020,"-ctloffset");
      lVar3 = cmd_ln_int_r(local_4020,"-ctlcount");
      ctl_process(&local_4058,pcVar2,(char *)0x0,ctlmllrfile,(int32)lVar1,(int32)lVar3,utt_align,
                  local_4020);
      if (0 < tot_nfr) {
        printf("\n");
        printf("TOTAL FRAMES:       %8d\n",(ulong)(uint)tot_nfr);
        printf("TOTAL CPU TIME:     %11.2f sec, %7.2f xRT\n",tm_utt.t_tot_cpu,
               (double)tm_utt.t_tot_cpu / ((double)tot_nfr * 0.01));
        printf("TOTAL ELAPSED TIME: %11.2f sec, %7.2f xRT\n",tm_utt.t_tot_elapsed,
               (double)tm_utt.t_tot_elapsed / ((double)tot_nfr * 0.01));
      }
      if (outsentfp != (FILE *)0x0) {
        fclose((FILE *)outsentfp);
      }
      if (outctlfp != (FILE *)0x0) {
        fclose((FILE *)outctlfp);
      }
      if (sentfp != (FILE *)0x0) {
        fclose((FILE *)sentfp);
      }
      ckd_free(s2stsegdir);
      ckd_free(stsegdir);
      ckd_free(phsegdir);
      ckd_free(wdsegdir);
      feat_array_free(feat);
      align_free();
      models_free();
      cmd_ln_free_r(local_4020);
      return 0;
    }
    pcVar2 = fgets((char *)&config,0x4000,(FILE *)sentfp);
    if (pcVar2 == (char *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
              ,0x3c4,"EOF(%s)\n",sentfile);
      goto LAB_00118629;
    }
    ctloffset = ctloffset + -1;
  } while( true );
}

Assistant:

int
main(int32 argc, char *argv[])
{
    char sent[16384];
    cmd_ln_t *config;

    cmd_ln_appl_enter(argc, argv, "default.arg", defn);

    config = cmd_ln_get();

    ctloffset = cmd_ln_int32_r(config, "-ctloffset");
    sentfile = cmd_ln_str_r(config, "-insent");

    if ((sentfp = fopen(sentfile, "r")) == NULL)
        E_FATAL_SYSTEM("Failed to open file %s for reading", sentfile);

    /* Note various output directories */
    if (cmd_ln_str_r(config, "-s2stsegdir") != NULL)
        s2stsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-s2stsegdir"));
    if (cmd_ln_str_r(config, "-stsegdir") != NULL)
        stsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-stsegdir"));
    if (cmd_ln_str_r(config, "-phsegdir") != NULL)
        phsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-phsegdir"));
    if (cmd_ln_str_r(config, "-phlabdir") != NULL)
        phlabdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-phlabdir"));
    if (cmd_ln_str_r(config, "-wdsegdir") != NULL)
        wdsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-wdsegdir"));

    /* HACK! Pre-read insent without checking whether ctl could also 
       be read.  In general, this is caused by the fact that we used
       multiple files to specify resource in sphinx III.  This is easy
       to solve but currently I just to remove process_ctl because it
       duplicates badly with ctl_process.  

       The call back function will take care of matching the uttfile
       names. We don't need to worry too much about inconsistency. 
     */

    while (ctloffset > 0) {
        if (fgets(sent, sizeof(sent), sentfp) == NULL) {
            E_ERROR("EOF(%s)\n", sentfile);
            break;
        }
        --ctloffset;
    }

    if ((outsentfile = cmd_ln_str_r(config, "-outsent")) != NULL) {
        if ((outsentfp = fopen(outsentfile, "w")) == NULL)
            E_FATAL_SYSTEM("Failed to open file %s for writing", outsentfile);
    }

    if ((outctlfile = cmd_ln_str_r(config, "-outctl")) != NULL) {
        if ((outctlfp = fopen(outctlfile, "w")) == NULL)
            E_FATAL_SYSTEM("Failed top open file %s for writing", outctlfile);
    }

    if ((cmd_ln_str_r(config, "-s2stsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-stsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-phlabdir") == NULL) &&
        (cmd_ln_str_r(config, "-phsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-wdsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-outsent") == NULL))
        E_FATAL("Missing output file/directory argument(s)\n");

    /* Read in input databases */
    models_init(config);

    if (!feat)
        feat = feat_array_alloc(kbcore_fcb(kbc), S3_MAX_FRAMES);

    timers[tmr_utt].name = "U";
    timers[tmr_gauden].name = "G";
    timers[tmr_senone].name = "S";
    timers[tmr_align].name = "A";

    /* Initialize align module */
    align_init(kbc->mdef, kbc->tmat, dict, config, kbc->logmath);
    printf("\n");

    if (cmd_ln_str_r(config, "-mllr") != NULL) {
        if (kbc->mgau)
            adapt_set_mllr(adapt_am, kbc->mgau, cmd_ln_str_r(config, "-mllr"), NULL,
                           kbc->mdef, config);
        else if (kbc->ms_mgau)
            model_set_mllr(kbc->ms_mgau, cmd_ln_str_r(config, "-mllr"), NULL, kbcore_fcb(kbc),
                           kbc->mdef, config);
        else
            E_WARN("Can't use MLLR matrices with .s2semi. yet\n");
    }

    tot_nfr = 0;

    /*  process_ctlfile (); */

    if (cmd_ln_str_r(config, "-ctl")) {
        /* When -ctlfile is speicified, corpus.c will look at -ctl_mllr to get
           the corresponding  MLLR for the utterance */
        ctl_process(cmd_ln_str_r(config, "-ctl"),
                    NULL,
                    cmd_ln_str_r(config, "-ctl_mllr"),
                    cmd_ln_int32_r(config, "-ctloffset"),
                    cmd_ln_int32_r(config, "-ctlcount"),
                    utt_align, config);
    }
    else {
        E_FATAL(" -ctl are not specified.\n");
    }

    if (tot_nfr > 0) {
        printf("\n");
        printf("TOTAL FRAMES:       %8d\n", tot_nfr);
        printf("TOTAL CPU TIME:     %11.2f sec, %7.2f xRT\n",
               tm_utt.t_tot_cpu, tm_utt.t_tot_cpu / (tot_nfr * 0.01));
        printf("TOTAL ELAPSED TIME: %11.2f sec, %7.2f xRT\n",
               tm_utt.t_tot_elapsed,
               tm_utt.t_tot_elapsed / (tot_nfr * 0.01));
    }

    if (outsentfp)
        fclose(outsentfp);
    if (outctlfp)
        fclose(outctlfp);
    if (sentfp)
        fclose(sentfp);

    ckd_free(s2stsegdir);
    ckd_free(stsegdir);
    ckd_free(phsegdir);
    ckd_free(wdsegdir);

    feat_array_free(feat);
    align_free();
    models_free();

    cmd_ln_free_r(config);
    return 0;
}